

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetBXTransform(ndicapi *pol,int portHandle,float *transform)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float *pfVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar1 = pol->BxHandleCount;
  if (bVar1 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    while (pol->BxHandles[uVar7] != portHandle) {
      uVar7 = uVar7 + 1;
      if ((uint)bVar1 == uVar7) {
        return 1;
      }
    }
  }
  if ((uint)uVar7 == (uint)bVar1) {
    return 1;
  }
  uVar7 = uVar7 & 0xffffffff;
  uVar2 = *(undefined8 *)pol->BxTransforms[uVar7];
  uVar3 = *(undefined8 *)(pol->BxTransforms[uVar7] + 2);
  pfVar5 = pol->BxTransforms[uVar7];
  uVar4 = *(undefined8 *)(pfVar5 + 6);
  *(undefined8 *)(transform + 4) = *(undefined8 *)(pfVar5 + 4);
  *(undefined8 *)(transform + 6) = uVar4;
  *(undefined8 *)transform = uVar2;
  *(undefined8 *)(transform + 2) = uVar3;
  uVar6 = 1;
  if ((pol->BxHandlesStatus[uVar7] & 4U) == 0) {
    uVar6 = (byte)pol->BxHandlesStatus[uVar7] & 2;
  }
  return uVar6;
}

Assistant:

ndicapiExport int ndiGetBXTransform(ndicapi* pol, int portHandle, float transform[8])
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(&transform[0], &pol->BxTransforms[i][0], sizeof(float) * 8);
  if (pol->BxHandlesStatus[i] & NDI_HANDLE_DISABLED)
  {
    return NDI_DISABLED;
  }
  else if (pol->BxHandlesStatus[i] & NDI_HANDLE_MISSING)
  {
    return NDI_MISSING;
  }

  return NDI_OKAY;
}